

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

void tar_flush_unconsumed(archive_read *a,int64_t *unconsumed)

{
  if (*unconsumed != 0) {
    __archive_read_consume(a,*unconsumed);
    *unconsumed = 0;
  }
  return;
}

Assistant:

static void
tar_flush_unconsumed(struct archive_read *a, int64_t *unconsumed)
{
	if (*unconsumed) {
/*
		void *data = (void *)__archive_read_ahead(a, *unconsumed, NULL);
		 * this block of code is to poison claimed unconsumed space, ensuring
		 * things break if it is in use still.
		 * currently it WILL break things, so enable it only for debugging this issue
		if (data) {
			memset(data, 0xff, *unconsumed);
		}
*/
		__archive_read_consume(a, *unconsumed);
		*unconsumed = 0;
	}
}